

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

void __thiscall CVmObjTads::change_superclass_list(CVmObjTads *this,vm_val_t *lst,int cnt)

{
  vm_tadsobj_hdr *hdr;
  vm_obj_id_t vVar1;
  long lVar2;
  uint uVar3;
  vm_val_t ele;
  vm_val_t local_50;
  vm_val_t local_40;
  
  uVar3 = 0;
  if (0 < cnt) {
    uVar3 = cnt;
  }
  if (0xfffe < (int)uVar3) {
    uVar3 = 0xffff;
  }
  hdr = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
  if (hdr->sc_cnt < uVar3) {
    hdr = vm_tadsobj_hdr::expand_to(this,hdr,(ulong)uVar3,(ulong)hdr->prop_entry_cnt);
    (this->super_CVmObject).ext_ = (char *)hdr;
  }
  hdr->sc_cnt = (unsigned_short)uVar3;
  if (0 < cnt) {
    vVar1 = 1;
    lVar2 = 0;
    do {
      local_40.typ = VM_INT;
      local_40.val.obj = vVar1;
      vm_val_t::ll_index(lst,&local_50,&local_40);
      *(vm_obj_id_t *)((long)&hdr->sc[0].id + lVar2) = local_50.val.obj;
      *(char **)((long)&hdr->sc[0].objp + lVar2) =
           (G_obj_table_X.pages_[local_50.val.obj >> 0xc]->ptr_).obj_ +
           (local_50.val.obj & 0xfff) * 0x18;
      lVar2 = lVar2 + 0x10;
      vVar1 = vVar1 + 1;
    } while ((ulong)uVar3 << 4 != lVar2);
  }
  if (hdr->inh_path != (tadsobj_objid_and_ptr *)0x0) {
    free(hdr->inh_path);
    hdr->inh_path = (tadsobj_objid_and_ptr *)0x0;
  }
  return;
}

Assistant:

void CVmObjTads::change_superclass_list(VMG_ const vm_val_t *lst, int cnt)
{
    vm_tadsobj_hdr *hdr = get_hdr();
    int i;

    /* keep the count within range */
    cnt = (cnt > UINT16MAXVAL ? UINT16MAXVAL : cnt < 0 ? 0 : cnt);
    
    /* 
     *   if we're increasing the number of superclasses, expand our object
     *   header to make room 
     */
    if (cnt > (int)hdr->sc_cnt)
    {
        /* expand the header to accomodate the new superclass list */
        ext_ = (char *)vm_tadsobj_hdr::expand_to(
            vmg_ this, hdr, cnt, hdr->prop_entry_cnt);

        /* get the new header */
        hdr = get_hdr();
    }

    /* set the new superclass count */
    hdr->sc_cnt = (ushort)cnt;

    /* set the new superclasses */
    for (i = 0 ; i < cnt ; ++i)
    {
        vm_val_t ele;

        /* get this element from the list */
        lst->ll_index(vmg_ &ele, i+1);

        /* set this superclass in the header */
        hdr->sc[i].id = ele.val.obj;
        hdr->sc[i].objp = (CVmObjTads *)vm_objp(vmg_ ele.val.obj);
    }

    /* invalidate the cached inheritance path */
    hdr->inval_inh_path();
}